

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hooking.cpp
# Opt level: O1

void __thiscall ChickenHook::Hooking::installHandler(Hooking *this)

{
  sigaction sa;
  sigaction local_a8;
  
  memset(&local_a8,0,0x98);
  sigemptyset(&local_a8.sa_mask);
  local_a8.__sigaction_handler.sa_handler = trampoline_receiver;
  local_a8.sa_flags = 4;
  sigaction(4,&local_a8,(sigaction *)0x0);
  sigaction(0xb,&local_a8,(sigaction *)0x0);
  return;
}

Assistant:

void Hooking::installHandler() {
        struct sigaction sa;
        memset(&sa, 0, sizeof(struct sigaction));
        sigemptyset(&sa.sa_mask);
        sa.sa_sigaction = trampoline_receiver;
        sa.sa_flags = SA_SIGINFO;

        sigaction(SIGILL, &sa, nullptr);
        sigaction(SIGSEGV, &sa, nullptr);
    }